

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_perform_auth(connectdata *conn,char *mech,char *initresp)

{
  pop3_conn *pop3c;
  CURLcode result;
  char *initresp_local;
  char *mech_local;
  connectdata *conn_local;
  
  if (initresp == (char *)0x0) {
    pop3c._4_4_ = Curl_pp_sendf(&(conn->proto).ftpc.pp,"AUTH %s",mech);
  }
  else {
    pop3c._4_4_ = Curl_pp_sendf(&(conn->proto).ftpc.pp,"AUTH %s %s",mech,initresp);
  }
  return pop3c._4_4_;
}

Assistant:

static CURLcode pop3_perform_auth(struct connectdata *conn,
                                  const char *mech,
                                  const char *initresp)
{
  CURLcode result = CURLE_OK;
  struct pop3_conn *pop3c = &conn->proto.pop3c;

  if(initresp) {                                  /* AUTH <mech> ...<crlf> */
    /* Send the AUTH command with the initial response */
    result = Curl_pp_sendf(&pop3c->pp, "AUTH %s %s", mech, initresp);
  }
  else {
    /* Send the AUTH command */
    result = Curl_pp_sendf(&pop3c->pp, "AUTH %s", mech);
  }

  return result;
}